

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

string * __thiscall
util::make_string<CylHead&,char_const(&)[46]>
          (string *__return_storage_ptr__,util *this,CylHead *args,char (*args_1) [46])

{
  ostringstream local_198 [8];
  ostringstream ss;
  char (*args_local_1) [46];
  CylHead *args_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  ::operator<<((ostream *)local_198,(CylHead *)this);
  std::operator<<((ostream *)local_198,(char *)args);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Args&& ... args)
{
    std::ostringstream ss;
    (void)std::initializer_list<bool> {(ss << args, false)...};
    return ss.str();
}